

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void thanm_make_params(anm_instr_t *raw_instr,list_t *param_list,char *format)

{
  char type;
  int iVar1;
  value_t *value_00;
  thanm_param_t *data;
  thanm_param_t *param;
  ssize_t sStack_40;
  char c;
  ssize_t read;
  value_t *value;
  size_t v;
  size_t i;
  char *format_local;
  list_t *param_list_local;
  anm_instr_t *raw_instr_local;
  
  v = 0;
  value = (value_t *)0x0;
  while( true ) {
    if ((ulong)raw_instr->length - 8 <= v) {
      return;
    }
    value_00 = (value_t *)malloc(0x18);
    if (format == (char *)0x0) {
      type = 'S';
    }
    else {
      type = format[(long)value];
    }
    iVar1 = (int)type;
    if (((iVar1 == 0x4e) || (iVar1 - 0x6eU < 2)) || (iVar1 == 0x74)) {
      sStack_40 = value_from_data((uchar *)((long)&raw_instr[1].type + v),
                                  ((ulong)raw_instr->length - 8) - v,'S',value_00);
    }
    else {
      sStack_40 = value_from_data((uchar *)((long)&raw_instr[1].type + v),
                                  ((ulong)raw_instr->length - 8) - v,type,value_00);
    }
    if (sStack_40 == -1) break;
    v = sStack_40 + v;
    data = thanm_param_new((int)type);
    if (((uint)raw_instr->param_mask & 1 << ((byte)value & 0x1f)) != 0) {
      data->is_var = 1;
    }
    data->val = value_00;
    list_append_new(param_list,data);
    value = (value_t *)((long)&value->type + 1);
  }
  fprintf(_stderr,"%s: value read error in ins_%d:\ndata length = %zd, offset = %d, format = %s\n",
          argv0,(ulong)raw_instr->type,(ulong)raw_instr->length - 8,v & 0xffffffff,format);
  abort();
}

Assistant:

static void
thanm_make_params(
    anm_instr_t* raw_instr,
    list_t* param_list,
    const char* format
) {
    size_t i = 0;
    size_t v = 0;
    while(i < raw_instr->length - sizeof(anm_instr_t)) {
        value_t* value = (value_t*)malloc(sizeof(value_t));
        ssize_t read;
        char c = format ? format[v] : 'S';
        switch(c) {
            case 'o':
            case 't':
            case 'n':
            case 'N':
                read = value_from_data((const unsigned char*)&raw_instr->data[i],
                    raw_instr->length - sizeof(anm_instr_t) - i, 'S', value);
                break;
            default:
                read = value_from_data((const unsigned char*)&raw_instr->data[i],
                    raw_instr->length - sizeof(anm_instr_t) - i, c, value);
                break;
        }

        if (read == -1) {
            fprintf(stderr,
                "%s: value read error in ins_%d:\n"
                "data length = %zd, "
                "offset = %d, "
                "format = %s\n",
                argv0, raw_instr->type, raw_instr->length - sizeof(anm_instr_t), (int)i, format);
            abort();
        }

        i += read;
        thanm_param_t* param = thanm_param_new(c);
        if (raw_instr->param_mask & 1 << v) {
            param->is_var = 1;
        }

        param->val = value;

        list_append_new(param_list, param);
        ++v;
    }
}